

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_map_field.cc
# Opt level: O2

FieldDescriptor *
google::protobuf::compiler::java::anon_unknown_1::ValueField(FieldDescriptor *descriptor)

{
  Type TVar1;
  LogMessage *pLVar2;
  Descriptor *this;
  FieldDescriptor *pFVar3;
  LogFinisher local_49;
  LogMessage local_48;
  
  TVar1 = FieldDescriptor::type(descriptor);
  if (TVar1 != TYPE_MESSAGE) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_map_field_lite.cc"
               ,0x36);
    pLVar2 = internal::LogMessage::operator<<
                       (&local_48,
                        "CHECK failed: (FieldDescriptor::TYPE_MESSAGE) == (descriptor->type()): ");
    internal::LogFinisher::operator=(&local_49,pLVar2);
    internal::LogMessage::~LogMessage(&local_48);
  }
  this = FieldDescriptor::message_type(descriptor);
  if (*(char *)(*(long *)(this + 0x20) + 0x6b) == '\0') {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_map_field_lite.cc"
               ,0x38);
    pLVar2 = internal::LogMessage::operator<<
                       (&local_48,"CHECK failed: message->options().map_entry(): ");
    internal::LogFinisher::operator=(&local_49,pLVar2);
    internal::LogMessage::~LogMessage(&local_48);
  }
  std::__cxx11::string::string((string *)&local_48,"value",(allocator *)&local_49);
  pFVar3 = Descriptor::FindFieldByName(this,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return pFVar3;
}

Assistant:

const FieldDescriptor* ValueField(const FieldDescriptor* descriptor) {
  GOOGLE_CHECK_EQ(FieldDescriptor::TYPE_MESSAGE, descriptor->type());
  const Descriptor* message = descriptor->message_type();
  GOOGLE_CHECK(message->options().map_entry());
  return message->FindFieldByName("value");
}